

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  xmlChar *pxVar3;
  int len;
  int iVar4;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr pxVar5;
  xmlXPathObjectPtr pxVar6;
  int *piVar7;
  _xmlNode *p_Var8;
  undefined4 extraout_var;
  xmlChar *pxVar9;
  xmlNodePtr pxVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  xmlNodePtr pxVar14;
  xmlChar *str;
  xmlNodePtr pxVar15;
  int iVar16;
  xmlNodePtr pxVar17;
  int local_c8;
  int local_c4;
  int local_c0;
  char local_bb;
  char local_ba;
  xmlChar local_b9;
  xmlNodePtr local_b8;
  xmlNodePtr start;
  xmlLocationSetPtr local_a8;
  xmlXPathObjectPtr local_a0;
  xmlXPathObjectPtr local_98;
  xmlXPathObjectPtr local_90;
  xmlNodePtr local_88;
  int local_80;
  int rindx;
  xmlChar *local_78;
  ulong local_70;
  int local_68;
  int local_64;
  xmlXPathParserContextPtr local_60;
  xmlXPathObjectPtr local_58;
  xmlNodePtr rend;
  int *local_48;
  long local_40;
  undefined8 local_38;
  
  if (nargs - 5U < 0xfffffffd) {
    xmlXPathErr(ctxt,0xc);
    return;
  }
  local_80 = -1;
  if ((uint)nargs < 4) {
    uVar11 = 0;
    local_a0 = (xmlXPathObjectPtr)0x0;
    if (nargs == 3) goto LAB_001e0e03;
    local_70 = 0;
    local_a0 = (xmlXPathObjectPtr)0x0;
LAB_001e0e77:
    obj = (xmlXPathObjectPtr)0x0;
LAB_001e0e7a:
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
      local_90 = valuePop(ctxt);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
         ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
        xmlXPathErr(ctxt,0xb);
        pxVar5 = (xmlXPathObjectPtr)0x0;
        pxVar6 = local_90;
        goto LAB_001e0f42;
      }
      local_98 = obj;
      pxVar5 = valuePop(ctxt);
      local_a8 = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
      obj = local_98;
      if (local_a8 == (xmlLocationSetPtr)0x0) {
        xmlXPathErr(ctxt,0xf);
        obj = local_98;
        pxVar6 = local_90;
        goto LAB_001e0f42;
      }
      local_60 = ctxt;
      if (pxVar5->nodesetval != (xmlNodeSetPtr)0x0) {
        pxVar6 = pxVar5;
        if (pxVar5->type == XPATH_NODESET) {
          pxVar6 = xmlXPtrNewLocationSetNodeSet(pxVar5->nodesetval);
          xmlXPathFreeObject(pxVar5);
          if (pxVar6 == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(local_60,0xf);
            goto LAB_001e1411;
          }
        }
        pxVar5 = pxVar6;
        local_48 = (int *)pxVar5->user;
        local_ba = 0 < (int)local_70 && local_a0 != (xmlXPathObjectPtr)0x0;
        local_bb = (int)local_70 < 1 && local_a0 != (xmlXPathObjectPtr)0x0;
        local_c8 = 0;
        local_b8 = (xmlNodePtr)0x0;
        lVar12 = 0;
        local_58 = pxVar5;
        while (lVar12 < *local_48) {
          piVar7 = *(int **)(*(long *)(local_48 + 2) + lVar12 * 8);
          if (piVar7 != (int *)0x0) {
            if (*piVar7 - 5U < 2) {
              start = *(xmlNodePtr *)(piVar7 + 10);
              local_c4 = piVar7[0xc];
              if (local_c4 < 1) {
                local_c4 = 0;
              }
              piVar7 = *(int **)(*(long *)(local_48 + 2) + lVar12 * 8);
              if (piVar7 == (int *)0x0) goto LAB_001e1076;
            }
            if (*piVar7 - 5U < 2) {
              local_b8 = *(xmlNodePtr *)(piVar7 + 10);
              local_c8 = piVar7[0xc];
              if (local_c8 < 1) {
                local_c8 = 0;
              }
            }
          }
LAB_001e1076:
          xmlXPtrAdvanceChar(&start,&local_c4,0);
          local_40 = lVar12;
          if (local_b8 == (xmlNodePtr)0x0) {
            local_b8 = (xmlNodePtr)0x0;
          }
          else {
            xVar2 = local_b8->type;
            p_Var8 = local_b8;
            if ((xVar2 == XML_ELEMENT_NODE) || (xVar2 == XML_DOCUMENT_NODE)) {
LAB_001e10ca:
              if (0 < local_c8) {
                p_Var8 = xmlXPtrGetNthChild(local_b8,local_c8);
              }
            }
            else {
              if (xVar2 == XML_NAMESPACE_DECL) goto LAB_001e1108;
              if (xVar2 == XML_HTML_DOCUMENT_NODE) goto LAB_001e10ca;
            }
            do {
              pxVar10 = p_Var8;
              if (pxVar10 == (xmlNodePtr)0x0) goto LAB_001e1108;
              p_Var8 = pxVar10->last;
            } while (pxVar10->last != (_xmlNode *)0x0);
            if ((pxVar10->type != XML_ELEMENT_NODE) && (pxVar10->content != (xmlChar *)0x0)) {
              local_c8 = xmlStrlen(pxVar10->content);
              local_b8 = pxVar10;
            }
          }
LAB_001e1108:
          str = local_90->stringval;
LAB_001e1111:
          pxVar5 = local_58;
          if (((str != (xmlChar *)0x0) && (start != (xmlNodePtr)0x0)) &&
             (start->type != XML_NAMESPACE_DECL)) {
            iVar13 = local_c4 + -1;
            local_b9 = *str;
            pxVar10 = start;
            do {
              if ((pxVar10->type != XML_ELEMENT_NODE) && (pxVar10->content != (xmlChar *)0x0)) {
                local_64 = xmlStrlen(pxVar10->content);
                local_38 = CONCAT44(extraout_var,local_64);
                local_64 = local_64 + 1;
                pxVar15 = pxVar10;
                pxVar3 = str;
                pxVar17 = local_b8;
                local_88 = pxVar10;
                local_78 = str;
                local_68 = iVar13;
LAB_001e1184:
                str = pxVar3;
                pxVar10 = pxVar15;
                obj = local_98;
                pxVar5 = local_58;
                if (iVar13 <= (int)local_38) {
                  pxVar15 = pxVar10;
                  if (local_b9 != '\0') goto code_r0x001e119f;
                  pxVar14 = pxVar10;
                  iVar4 = local_68 + 1;
                  iVar13 = local_68 + 1;
                  goto LAB_001e12f8;
                }
              }
              if ((pxVar10 == local_b8) && (local_c8 <= iVar13)) break;
              pxVar10 = xmlXPtrAdvanceNode(pxVar10,(int *)0x0);
              iVar13 = 1;
            } while (pxVar10 != (xmlNodePtr)0x0);
          }
          lVar12 = local_40 + 1;
        }
      }
LAB_001e1411:
      pxVar6 = xmlXPtrWrapLocationSet(local_a8);
      valuePush(local_60,pxVar6);
      pxVar6 = local_90;
      goto LAB_001e0f42;
    }
    xmlXPathErr(ctxt,0xb);
  }
  else {
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathErr(ctxt,0xb);
      local_a0 = (xmlXPathObjectPtr)0x0;
    }
    else {
      local_a0 = valuePop(ctxt);
      if (local_a0 == (xmlXPathObjectPtr)0x0) {
        uVar11 = 0;
        local_a0 = (xmlXPathObjectPtr)0x0;
      }
      else {
        uVar11 = (ulong)(uint)(int)local_a0->floatval;
      }
LAB_001e0e03:
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) {
        local_70 = uVar11;
        obj = valuePop(ctxt);
        if (obj == (xmlXPathObjectPtr)0x0) goto LAB_001e0e77;
        local_80 = (int)obj->floatval + -1;
        goto LAB_001e0e7a;
      }
      xmlXPathErr(ctxt,0xb);
    }
    obj = (xmlXPathObjectPtr)0x0;
  }
  pxVar5 = (xmlXPathObjectPtr)0x0;
  pxVar6 = (xmlXPathObjectPtr)0x0;
LAB_001e0f42:
  xmlXPathFreeObject(pxVar5);
  xmlXPathFreeObject(pxVar6);
  if (obj != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(obj);
  }
  if (local_a0 != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(local_a0);
  }
  return;
code_r0x001e119f:
  pxVar9 = xmlStrchr(pxVar10->content + iVar13,local_b9);
  pxVar3 = str;
  iVar13 = local_64;
  if (pxVar9 == (xmlChar *)0x0) goto LAB_001e1184;
  iVar16 = (int)pxVar9 - *(int *)&pxVar10->content;
  iVar13 = iVar16 + 1;
  iVar4 = local_c8;
  local_c0 = iVar13;
  if ((pxVar10->type == XML_NAMESPACE_DECL) || (pxVar17 == (xmlNodePtr)0x0)) {
    pxVar14 = (xmlNodePtr)0x0;
    if (pxVar10->type == XML_NAMESPACE_DECL) {
      pxVar14 = pxVar17;
    }
  }
  else {
    pxVar14 = pxVar17;
    if (pxVar17->type != XML_NAMESPACE_DECL) {
      len = xmlStrlen(str);
      do {
        pxVar14 = pxVar17;
        pxVar15 = local_88;
        iVar4 = local_c8;
        iVar13 = local_c0;
        if (len < 1) goto LAB_001e12f8;
        iVar4 = iVar16 + len;
        if ((pxVar10 == pxVar17) && (pxVar3 = local_78, local_c8 < iVar4)) break;
        if ((pxVar10->type != XML_ELEMENT_NODE) && (pxVar10->content != (xmlChar *)0x0)) {
          iVar13 = xmlStrlen(pxVar10->content);
          if (iVar4 <= iVar13) {
            iVar16 = xmlStrncmp(pxVar10->content + iVar16,str,len);
            pxVar14 = pxVar10;
            pxVar15 = local_88;
            pxVar3 = local_78;
            pxVar17 = local_b8;
            iVar13 = local_c0;
            if (iVar16 == 0) goto LAB_001e12f8;
            break;
          }
          iVar13 = iVar13 - iVar16;
          iVar4 = xmlStrncmp(pxVar10->content + iVar16,str,iVar13);
          str = str + iVar13;
          len = len - iVar13;
          pxVar15 = local_88;
          pxVar3 = local_78;
          pxVar17 = local_b8;
          iVar13 = local_c0;
          if (iVar4 != 0) break;
        }
        iVar16 = 0;
        pxVar10 = xmlXPtrAdvanceNode(pxVar10,(int *)0x0);
        pxVar15 = local_88;
        pxVar3 = local_78;
        iVar13 = local_c0;
      } while (pxVar10 != (xmlNodePtr)0x0);
      goto LAB_001e1184;
    }
  }
LAB_001e12f8:
  obj = local_98;
  pxVar10 = pxVar14;
  iVar16 = iVar4;
  local_c4 = iVar13;
  start = pxVar15;
  if (local_98 != (xmlXPathObjectPtr)0x0) {
    iVar13 = xmlXPtrAdvanceChar(&start,&local_c4,local_80);
    if (iVar13 != 0) goto LAB_001e1383;
    if (local_ba == '\0') {
      if (local_bb != '\0') {
        pxVar10 = start;
        iVar16 = local_c4;
      }
    }
    else {
      rend = start;
      rindx = local_c4 + -1;
      iVar13 = xmlXPtrAdvanceChar(&rend,&rindx,(int)local_70);
      pxVar10 = rend;
      iVar16 = rindx;
      if (iVar13 != 0) goto LAB_001e1383;
    }
  }
  pxVar5 = xmlXPtrNewRange(start,local_c4,pxVar10,iVar16);
  xmlXPtrLocationSetAdd(local_a8,pxVar5);
LAB_001e1383:
  str = local_90->stringval;
  local_c4 = iVar4;
  start = pxVar14;
  if (*str == '\0') {
    local_c4 = iVar4 + 1;
  }
  goto LAB_001e1111;
}

Assistant:

static void
xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i, startindex, endindex = 0, fendindex;
    xmlNodePtr start, end = 0, fend;
    xmlXPathObjectPtr set = NULL;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset = NULL;
    xmlXPathObjectPtr string = NULL;
    xmlXPathObjectPtr position = NULL;
    xmlXPathObjectPtr number = NULL;
    int found, pos = 0, num = 0;

    /*
     * Grab the arguments
     */
    if ((nargs < 2) || (nargs > 4))
	XP_ERROR(XPATH_INVALID_ARITY);

    if (nargs >= 4) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	number = valuePop(ctxt);
	if (number != NULL)
	    num = (int) number->floatval;
    }
    if (nargs >= 3) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	position = valuePop(ctxt);
	if (position != NULL)
	    pos = (int) position->floatval;
    }
    if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_STRING)) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    string = valuePop(ctxt);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET))) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    set = valuePop(ctxt);
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
        xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
        goto error;
    }
    if (set->nodesetval == NULL) {
        goto error;
    }
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL) {
            xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
            goto error;
        }
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to search for each element in the location set
     * the list of location set corresponding to that search
     */
    for (i = 0;i < oldset->locNr;i++) {
#ifdef DEBUG_RANGES
	xmlXPathDebugDumpObject(stdout, oldset->locTab[i], 0);
#endif

	xmlXPtrGetStartPoint(oldset->locTab[i], &start, &startindex);
	xmlXPtrGetEndPoint(oldset->locTab[i], &end, &endindex);
	xmlXPtrAdvanceChar(&start, &startindex, 0);
	xmlXPtrGetLastChar(&end, &endindex);

#ifdef DEBUG_RANGES
	xmlGenericError(xmlGenericErrorContext,
		"from index %d of ->", startindex);
	xmlDebugDumpString(stdout, start->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
	xmlGenericError(xmlGenericErrorContext,
		"to index %d of ->", endindex);
	xmlDebugDumpString(stdout, end->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
#endif
	do {
            fend = end;
            fendindex = endindex;
	    found = xmlXPtrSearchString(string->stringval, &start, &startindex,
		                        &fend, &fendindex);
	    if (found == 1) {
		if (position == NULL) {
		    xmlXPtrLocationSetAdd(newset,
			 xmlXPtrNewRange(start, startindex, fend, fendindex));
		} else if (xmlXPtrAdvanceChar(&start, &startindex,
			                      pos - 1) == 0) {
		    if ((number != NULL) && (num > 0)) {
			int rindx;
			xmlNodePtr rend;
			rend = start;
			rindx = startindex - 1;
			if (xmlXPtrAdvanceChar(&rend, &rindx,
				               num) == 0) {
			    xmlXPtrLocationSetAdd(newset,
					xmlXPtrNewRange(start, startindex,
							rend, rindx));
			}
		    } else if ((number != NULL) && (num <= 0)) {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    start, startindex));
		    } else {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    fend, fendindex));
		    }
		}
		start = fend;
		startindex = fendindex;
		if (string->stringval[0] == 0)
		    startindex++;
	    }
	} while (found == 1);
    }

    /*
     * Save the new value and cleanup
     */
error:
    if (newset != NULL)
        valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
    xmlXPathFreeObject(string);
    if (position) xmlXPathFreeObject(position);
    if (number) xmlXPathFreeObject(number);
}